

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

uint __thiscall apngasm::APNGAsm::read_chunk(APNGAsm *this,FILE *f,CHUNK *pChunk)

{
  undefined8 in_RAX;
  size_t sVar1;
  uchar (*pauVar2) [4];
  uint uVar3;
  uint uVar4;
  uchar len [4];
  
  len = SUB84((ulong)in_RAX >> 0x20,0);
  sVar1 = fread(len,4,1,(FILE *)f);
  uVar3 = 0;
  if (sVar1 == 1) {
    uVar4 = (uint)len >> 0x18 | ((uint)len & 0xff0000) >> 8 | ((uint)len & 0xff00) << 8 |
            (int)len << 0x18;
    uVar3 = uVar4 + 0xc;
    pChunk->size = uVar3;
    pauVar2 = (uchar (*) [4])operator_new__((ulong)uVar3);
    pChunk->p = (uchar *)pauVar2;
    *pauVar2 = len;
    sVar1 = fread(pauVar2 + 1,(ulong)(uVar4 + 8),1,(FILE *)f);
    uVar3 = 0;
    if (sVar1 == 1) {
      uVar3 = *(uint *)(pChunk->p + 4);
    }
  }
  return uVar3;
}

Assistant:

unsigned int APNGAsm::read_chunk(FILE * f, CHUNK * pChunk)
  {
    unsigned char len[4];
    if (fread(&len, 4, 1, f) == 1)
    {
      pChunk->size = png_get_uint_32(len) + 12;
      pChunk->p = new unsigned char[pChunk->size];
      memcpy(pChunk->p, len, 4);
      if (fread(pChunk->p + 4, pChunk->size - 4, 1, f) == 1)
        return *(unsigned int *)(pChunk->p + 4);
    }
    return 0;
  }